

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O2

int __thiscall Jupiter::HTTP::Server::Data::process_request(Data *this,HTTPSession *session)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view name;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  bool bVar1;
  int iVar2;
  long lVar3;
  Host *pHVar4;
  size_type sVar5;
  undefined8 *puVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  char *pcVar7;
  long *plVar8;
  _If_sv<std::basic_string_view<char>,_size_type> _Var9;
  value_type vVar10;
  char *pcVar11;
  size_type __pos;
  uint uVar12;
  size_t sVar13;
  string *in_string;
  basic_string_view<char,_std::char_traits<char>_> *__svt;
  int in_R8D;
  _Head_base<0UL,_Jupiter::HTTP::Server::Host_*,_false> _Var14;
  long lVar15;
  basic_string_view<char,_std::char_traits<char>_> lhs_00;
  basic_string_view<char,_std::char_traits<char>_> lhs_01;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> rhs_00;
  basic_string_view<char,_std::char_traits<char>_> rhs_01;
  basic_string_view<char,_std::char_traits<char>_> rhs_02;
  basic_string_view<char,_std::char_traits<char>_> rhs_03;
  basic_string_view<char,_std::char_traits<char>_> rhs_04;
  basic_string_view<char,_std::char_traits<char>_> rhs_05;
  basic_string_view<char,_std::char_traits<char>_> bVar16;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  first_split;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  Data *local_98;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  second_split;
  string_view line;
  long local_58;
  container_type lines;
  undefined4 extraout_var;
  
  in_string = &session->request;
  first_split.first._M_len = 2;
  first_split.first._M_str = "\r\n";
  local_98 = this;
  jessilib::
  split<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            (&lines,in_string,&first_split.first);
  local_a8._M_len = 0;
  local_a8._M_str = (char *)0x0;
  uVar12 = 3;
  lVar15 = -1;
  local_58 = 0;
  puVar6 = (undefined8 *)0x0;
  lVar3 = 0;
  do {
    if (lVar3 == (long)lines.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)lines.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) {
LAB_0013b603:
      std::
      _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~_Vector_base(&lines.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     );
      return 0;
    }
    sVar13 = lines.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar3]._M_len;
    pcVar11 = lines.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar3]._M_str;
    while( true ) {
      line._M_str = pcVar11;
      line._M_len = sVar13;
      pcVar11 = line._M_str + 1;
      if (line._M_len - 1 == 0xffffffffffffffff) break;
      sVar13 = line._M_len - 1;
      if (*line._M_str != ' ') {
        first_split.first._M_len = (size_t)&first_split.second;
        first_split.first._M_str = (char *)0x0;
        first_split.second._M_len._0_1_ = 0;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&first_split
                   ,0x100);
        if (uVar12 < 2) {
          if (puVar6 == (undefined8 *)0x0) {
            if (session->version == HTTP_1_1) {
              second_split.first._M_len = 0x18;
              second_split.first._M_str = "HTTP/1.1 404 Not Found\r\n";
              std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                        ((string *)&first_split,&second_split.first);
            }
            else {
              second_split.first._M_len = 0x18;
              second_split.first._M_str = "HTTP/1.0 404 Not Found\r\n";
              std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                        ((string *)&first_split,&second_split.first);
            }
            pcVar7 = html_time();
            second_split.first._M_len = 8;
            second_split.first._M_str = "Date: \r\n";
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&first_split,&second_split.first);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &first_split,pcVar7);
            operator_delete__(pcVar7);
            second_split.first._M_len = 0x34;
            second_split.first._M_str = "Server: Jupiter master-2f1261b (Linux Apr 27 2025)\r\n";
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&first_split,&second_split.first);
            second_split.first._M_len = 0x13;
            second_split.first._M_str = "Content-Length: 0\r\n";
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&first_split,&second_split.first);
            if (session->keep_alive == true) {
              second_split.first._M_len = 0x18;
              second_split.first._M_str = "Connection: keep-alive\r\n";
              std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                        ((string *)&first_split,&second_split.first);
            }
            else {
              second_split.first._M_len = 0x13;
              second_split.first._M_str = "Connection: close\r\n";
              std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                        ((string *)&first_split,&second_split.first);
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &first_split,"\r\n\r\n");
            Socket::send(&session->sock,(int)first_split.first._M_str,
                         (void *)first_split.first._M_len,(size_t)pcVar11,in_R8D);
          }
          else {
            __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (**(code **)*puVar6)(puVar6,local_a8._M_len,local_a8._M_str);
            if (session->version == HTTP_1_1) {
              second_split.first._M_len = 0x11;
              second_split.first._M_str = "HTTP/1.1 200 OK\r\n";
              std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                        ((string *)&first_split,&second_split.first);
            }
            else {
              second_split.first._M_len = 0x11;
              second_split.first._M_str = "HTTP/1.0 200 OK\r\n";
              std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                        ((string *)&first_split,&second_split.first);
            }
            second_split.first._M_len = 6;
            second_split.first._M_str = "Date: ";
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&first_split,&second_split.first);
            pcVar7 = html_time();
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &first_split,pcVar7);
            operator_delete__(pcVar7);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &first_split,"\r\n");
            second_split.first._M_len = 0x34;
            second_split.first._M_str = "Server: Jupiter master-2f1261b (Linux Apr 27 2025)\r\n";
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&first_split,&second_split.first);
            second_split.first._M_len = 0x10;
            second_split.first._M_str = "Content-Length: ";
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&first_split,&second_split.first);
            std::__cxx11::to_string((string *)&second_split,__str->_M_string_length);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &first_split,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &second_split);
            std::__cxx11::string::~string((string *)&second_split);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &first_split,"\r\n");
            if (session->keep_alive == true) {
              second_split.first._M_len = 0x18;
              second_split.first._M_str = "Connection: keep-alive\r\n";
              std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                        ((string *)&first_split,&second_split.first);
            }
            else {
              second_split.first._M_len = 0x13;
              second_split.first._M_str = "Connection: close\r\n";
              std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                        ((string *)&first_split,&second_split.first);
            }
            second_split.first._M_len = 0xe;
            second_split.first._M_str = "Content-Type: ";
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&first_split,&second_split.first);
            __svt = (basic_string_view<char,_std::char_traits<char>_> *)
                    HTTP::Content::Type::Text::PLAIN;
            if (puVar6[10] != 0) {
              __svt = (basic_string_view<char,_std::char_traits<char>_> *)(puVar6 + 10);
            }
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&first_split,__svt);
            if (puVar6[0xc] != 0) {
              second_split.first._M_len = 10;
              second_split.first._M_str = "; charset=";
              std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                        ((string *)&first_split,&second_split.first);
              std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                        ((string *)&first_split,
                         (basic_string_view<char,_std::char_traits<char>_> *)(puVar6 + 0xc));
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &first_split,"\r\n");
            if (puVar6[8] != 0) {
              second_split.first._M_len = 0x12;
              second_split.first._M_str = "Content-Language: ";
              std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                        ((string *)&first_split,&second_split.first);
              std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                        ((string *)&first_split,
                         (basic_string_view<char,_std::char_traits<char>_> *)(puVar6 + 8));
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &first_split,"\r\n");
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &first_split,"\r\n");
            if (uVar12 == 0) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &first_split,__str);
            }
            if (*(char *)(puVar6 + 1) == '\x01') {
              std::__cxx11::string::~string((string *)__str);
              operator_delete(__str,0x20);
            }
            Socket::send(&session->sock,(int)first_split.first._M_str,
                         (void *)first_split.first._M_len,(size_t)pcVar11,in_R8D);
          }
        }
        if (session->keep_alive != false) {
          if (lVar3 + 1 ==
              (long)lines.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)lines.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (in_string,0,0xffffffffffffffff);
          }
          else {
            plVar8 = (long *)((long)&(lines.
                                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_len + local_58)
            ;
            __pos = 0;
            for (; lVar15 != 0; lVar15 = lVar15 + 1) {
              __pos = __pos + *plVar8 + 2;
              plVar8 = plVar8 + -2;
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &second_split,in_string,__pos,0xffffffffffffffff);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_string,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &second_split);
            std::__cxx11::string::~string((string *)&second_split);
          }
          _Var9 = std::__cxx11::string::find<std::basic_string_view<char,std::char_traits<char>>>
                            ((string *)in_string,&HTTP_REQUEST_ENDING,0);
          if (_Var9 != 0xffffffffffffffff) {
            process_request(local_98,session);
          }
        }
        std::__cxx11::string::~string((string *)&first_split);
        goto LAB_0013b603;
      }
    }
    jessilib::
    split_once<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              (&first_split,(jessilib *)&line,
               (basic_string_view<char,_std::char_traits<char>_> *)0x20,(value_type)pcVar11);
    pcVar11 = first_split.first._M_str;
    __x._M_str = first_split.first._M_str;
    __x._M_len = first_split.first._M_len;
    bVar16._M_str = first_split.first._M_str;
    bVar16._M_len = first_split.first._M_len;
    if (first_split.first._M_str[first_split.first._M_len - 1] == ':') {
      sVar13 = first_split.first._M_len - 1;
      lhs_00._M_str = first_split.first._M_str;
      lhs_00._M_len = sVar13;
      rhs._M_str = "HOST";
      rhs._M_len = 4;
      bVar1 = jessilib::equalsi<char,char>(lhs_00,rhs);
      if (bVar1) {
        name._1_15_ = first_split.second._1_15_;
        name._M_len._0_1_ = (undefined1)first_split.second._M_len;
        pHVar4 = find_host(local_98,name);
        session->host = pHVar4;
      }
      else {
        lhs_01._M_str = pcVar11;
        lhs_01._M_len = sVar13;
        rhs_00._M_str = "CONNECTION";
        rhs_00._M_len = 10;
        bVar1 = jessilib::equalsi<char,char>(lhs_01,rhs_00);
        if ((bVar1) &&
           (lhs._1_15_ = first_split.second._1_15_,
           lhs._M_len._0_1_ = (undefined1)first_split.second._M_len, rhs_01._M_str = "keep-alive",
           rhs_01._M_len = 10, bVar1 = jessilib::equalsi<char,char>(lhs,rhs_01), bVar1)) {
          session->keep_alive = local_98->permit_keept_alive;
        }
      }
    }
    else {
      __y._M_str = "GET";
      __y._M_len = 3;
      vVar10 = -0x5c;
      bVar1 = std::operator==(bVar16,__y);
      if (bVar1) {
        jessilib::
        split_once<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  (&second_split,(jessilib *)&first_split.second,
                   (basic_string_view<char,_std::char_traits<char>_> *)0x20,vVar10);
        local_a8._M_len = second_split.first._M_len;
        local_a8._M_str = second_split.first._M_str;
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_a8,'?',0);
        _Var14._M_head_impl = session->host;
        if (sVar5 == 0xffffffffffffffff) {
          if (_Var14._M_head_impl == (Host *)0x0) {
            _Var14._M_head_impl =
                 *(Host **)&(((local_98->m_hosts).
                              super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                            super___uniq_ptr_impl<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
            ;
          }
          iVar2 = (*(*(_func_int ***)_Var14._M_head_impl)[3])
                            (_Var14._M_head_impl,local_a8._M_len,local_a8._M_str);
          puVar6 = (undefined8 *)CONCAT44(extraout_var,iVar2);
          local_a8._M_len = 0;
          local_a8._M_str = (char *)0x0;
        }
        else {
          if ((_Head_base<0UL,_Jupiter::HTTP::Server::Host_*,_false>)_Var14._M_head_impl ==
              (_Head_base<0UL,_Jupiter::HTTP::Server::Host_*,_false>)0x0) {
            bVar16 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               (&local_a8,0,sVar5);
            _Var14._M_head_impl =
                 *(Host **)&(((local_98->m_hosts).
                              super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                            super___uniq_ptr_impl<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
            ;
          }
          else {
            bVar16 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               (&local_a8,0,sVar5);
          }
          iVar2 = (**(code **)(*(long *)_Var14._M_head_impl + 0x18))
                            (_Var14._M_head_impl,bVar16._M_len,bVar16._M_str);
          puVar6 = (undefined8 *)CONCAT44(extraout_var_00,iVar2);
          local_a8._M_str = local_a8._M_str + sVar5 + 1;
          local_a8._M_len = local_a8._M_len - (sVar5 + 1);
        }
        bVar16 = second_split.second;
        rhs_02._M_str = "http/1.0";
        rhs_02._M_len = 8;
        bVar1 = jessilib::equalsi<char,char>(second_split.second,rhs_02);
        if (bVar1) {
          session->version = HTTP_1_0;
        }
        else {
          rhs_03._M_str = "http/1.1";
          rhs_03._M_len = 8;
          bVar1 = jessilib::equalsi<char,char>(bVar16,rhs_03);
          if (bVar1) {
            session->version = HTTP_1_1;
            session->keep_alive = local_98->permit_keept_alive;
          }
        }
        uVar12 = 0;
      }
      else {
        __y_00._M_str = "HEAD";
        __y_00._M_len = 4;
        vVar10 = -0x46;
        bVar1 = std::operator==(__x,__y_00);
        uVar12 = 2;
        if (bVar1) {
          jessilib::
          split_once<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                    (&second_split,(jessilib *)&first_split.second,
                     (basic_string_view<char,_std::char_traits<char>_> *)0x20,vVar10);
          local_a8._M_len = second_split.first._M_len;
          local_a8._M_str = second_split.first._M_str;
          sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_a8,'?',0);
          _Var14._M_head_impl = session->host;
          if (sVar5 == 0xffffffffffffffff) {
            if (_Var14._M_head_impl == (Host *)0x0) {
              _Var14._M_head_impl =
                   *(Host **)&(((local_98->m_hosts).
                                super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                              super___uniq_ptr_impl<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
              ;
            }
            iVar2 = (*(*(_func_int ***)_Var14._M_head_impl)[3])
                              (_Var14._M_head_impl,local_a8._M_len,local_a8._M_str);
            puVar6 = (undefined8 *)CONCAT44(extraout_var_01,iVar2);
            local_a8._M_len = 0;
            local_a8._M_str = (char *)0x0;
          }
          else {
            if ((_Head_base<0UL,_Jupiter::HTTP::Server::Host_*,_false>)_Var14._M_head_impl ==
                (_Head_base<0UL,_Jupiter::HTTP::Server::Host_*,_false>)0x0) {
              bVar16 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                 (&local_a8,0,sVar5);
              _Var14._M_head_impl =
                   *(Host **)&(((local_98->m_hosts).
                                super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                              super___uniq_ptr_impl<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
              ;
            }
            else {
              bVar16 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                 (&local_a8,0,sVar5);
            }
            iVar2 = (**(code **)(*(long *)_Var14._M_head_impl + 0x18))
                              (_Var14._M_head_impl,bVar16._M_len,bVar16._M_str);
            puVar6 = (undefined8 *)CONCAT44(extraout_var_02,iVar2);
            local_a8._M_str = local_a8._M_str + sVar5 + 1;
            local_a8._M_len = local_a8._M_len - (sVar5 + 1);
          }
          bVar16 = second_split.second;
          rhs_04._M_str = "http/1.0";
          rhs_04._M_len = 8;
          bVar1 = jessilib::equalsi<char,char>(second_split.second,rhs_04);
          if (bVar1) {
            session->version = HTTP_1_0;
          }
          else {
            rhs_05._M_str = "http/1.1";
            rhs_05._M_len = 8;
            bVar1 = jessilib::equalsi<char,char>(bVar16,rhs_05);
            if (bVar1) {
              session->version = HTTP_1_1;
              session->keep_alive = local_98->permit_keept_alive;
            }
          }
          uVar12 = 1;
        }
      }
    }
    local_58 = local_58 + 0x10;
    lVar15 = lVar15 + -1;
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

int Jupiter::HTTP::Server::Data::process_request(HTTPSession &session) {
	auto lines = jessilib::split_view(session.request, "\r\n"sv);
	HTTPCommand command = HTTPCommand::NONE_SPECIFIED;
	Content *content = nullptr;
	std::string_view query_string;
	std::string_view first_token;
	size_t index = 0;
	size_t span;

	auto get_line_offset = [&session, &lines](size_t index)
	{
		size_t offset = 0;
		while (index != 0)
			offset += lines[--index].size() + 2;
		return offset;
	};

	while (index != lines.size())
	{
		std::string_view line = lines[index++];

		// trim front-end spaces.
		while (!line.empty() && line.front() == ' ') {
			line.remove_prefix(1);
		}

		if (!line.empty()) // end of http request
		{
			std::string result;
			result.reserve(256);
			switch (command)
			{
			case HTTPCommand::GET:
			case HTTPCommand::HEAD:
				if (content != nullptr)
				{
					// 200 (success)
					// TODO: remove referencestring warpper
					std::string* content_result = content->execute(query_string);

					switch (session.version)
					{
					default:
					case HTTPVersion::HTTP_1_0:
						result = "HTTP/1.0 200 OK"sv HTTP_ENDL;
						break;
					case HTTPVersion::HTTP_1_1:
						result = "HTTP/1.1 200 OK"sv HTTP_ENDL;
						break;
					}

					result += "Date: "sv;
					char *time_header = html_time();
					result += time_header;
					delete[] time_header;
					result += HTTP_ENDL;

					result += "Server: "sv JUPITER_VERSION HTTP_ENDL;
					result += "Content-Length: "sv;
					result += std::to_string(content_result->size()); // TODO: to_chars?
					result += HTTP_ENDL;

					if (session.keep_alive)
						result += "Connection: keep-alive"sv HTTP_ENDL;
					else
						result += "Connection: close"sv HTTP_ENDL;

					result += "Content-Type: "sv;
					if (content->type.empty()) {
						result += Jupiter::HTTP::Content::Type::Text::PLAIN;
					}
					else {
						result += content->type;
					}

					if (!content->charset.empty()) {
						result += "; charset="sv;
						result += content->charset;
					}
					result += HTTP_ENDL;

					if (!content->language.empty()) {
						result += "Content-Language: "sv;
						result += content->language;
						result += HTTP_ENDL;
					}

					result += HTTP_ENDL;
					if (command == HTTPCommand::GET)
						result += *content_result;

					if (content->free_result)
						delete content_result;

					session.sock.send(result);
				}
				else
				{
					// 404 (not found)

					switch (session.version)
					{
					default:
					case HTTPVersion::HTTP_1_0:
						result = "HTTP/1.0 404 Not Found"sv HTTP_ENDL;
						break;
					case HTTPVersion::HTTP_1_1:
						result = "HTTP/1.1 404 Not Found"sv HTTP_ENDL;
						break;
					}

					char *time_header = html_time();
					result += "Date: "sv HTTP_ENDL;
					result += time_header;
					delete[] time_header;

					result += "Server: "sv JUPITER_VERSION HTTP_ENDL;

					result += "Content-Length: 0"sv HTTP_ENDL;

					if (session.keep_alive)
						result += "Connection: keep-alive"sv HTTP_ENDL;
					else
						result += "Connection: close"sv HTTP_ENDL;

					result += HTTP_ENDL HTTP_ENDL;
					session.sock.send(result);
				}
				break;
			default:
				break;
			}

			if (session.keep_alive == false) {// not keep-alive -- will be destroyed on return
				break;
			}

			if (index == lines.size()) { // end of packet
				session.request.erase();
			}
			else { // end of request -- another request is following
				// Maybe there's still some value in a shifty string, to avoid substr calls & heap allocations...
				session.request = session.request.substr(get_line_offset(index));
			}

			if (session.request.find(HTTP_REQUEST_ENDING) != std::string::npos) { // there's another full request already received
				return process_request(session);
			}
			break;
		}

		// Not empty
		auto first_split = jessilib::split_once_view(line, ' ');
		first_token = first_split.first;

		if (first_token.back() == ':') { // header field
			first_token.remove_suffix(1); // trim trailing ':'
			if (jessilib::equalsi(first_token, "HOST"sv)) {
				session.host = find_host(first_split.second);
			}
			else if (jessilib::equalsi(first_token, "CONNECTION"sv)) {
				std::string_view connection_type = first_split.second;
				if (jessilib::equalsi(connection_type, "keep-alive"sv)) {
					session.keep_alive = permit_keept_alive;
				}
			}
		}
		else { // command
			if (first_token == "GET"sv) {
				command = HTTPCommand::GET;

				auto second_split = jessilib::split_once_view(first_split.second, ' ');
				query_string = second_split.first;
				span = query_string.find('?'); // repurposing 'span'
				if (span == std::string_view::npos) {
					if (session.host == nullptr) {
						content = find(query_string);
					}
					else {
						content = session.host->find(query_string);
					}
					query_string = std::string_view{};
				}
				else {
					if (session.host == nullptr) {
						content = find(query_string.substr(size_t{ 0 }, span));
					}
					else {
						content = session.host->find(query_string.substr(size_t{ 0 }, span));
					}
					query_string.remove_prefix(span + 1);
					// decode query_string here
				}

				std::string_view protocol_str = second_split.second;
				if (jessilib::equalsi(protocol_str, "http/1.0"sv)) {
					session.version = HTTPVersion::HTTP_1_0;
				}
				else if (jessilib::equalsi(protocol_str, "http/1.1"sv)) {
					session.version = HTTPVersion::HTTP_1_1;
					session.keep_alive = permit_keept_alive;
				}
			}
			else if (first_token == "HEAD"sv) {
				command = HTTPCommand::HEAD;

				auto second_split = jessilib::split_once_view(first_split.second, ' ');
				query_string = second_split.first;
				span = query_string.find('?'); // repurposing 'span'
				if (span == std::string_view::npos) {
					if (session.host == nullptr) {
						content = find(query_string);
					}
					else {
						content = session.host->find(query_string);
					}
					query_string = std::string_view{};
				}
				else {
					if (session.host == nullptr) {
						content = find(query_string.substr(size_t{ 0 }, span));
					}
					else {
						content = session.host->find(query_string.substr(size_t{ 0 }, span));
					}
					query_string.remove_prefix(span + 1);
					// decode query_string here
				}

				std::string_view protocol_str = second_split.second;
				if (jessilib::equalsi(protocol_str, "http/1.0"sv)) {
					session.version = HTTPVersion::HTTP_1_0;
				}
				else if (jessilib::equalsi(protocol_str, "http/1.1"sv)) {
					session.version = HTTPVersion::HTTP_1_1;
					session.keep_alive = permit_keept_alive;
				}
			}
			else
				command = HTTPCommand::UNKNOWN;
		}
	}
	return 0;
}